

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O2

bool __thiscall
cmCMakePolicyCommand::HandleVersionMode
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ulong uVar1;
  long lVar2;
  ostream *poVar3;
  bool bVar4;
  pointer pbVar5;
  string version_min;
  string version_max;
  string local_1b0;
  ostringstream e;
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5;
  if (uVar1 < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"VERSION not given an argument",(allocator<char> *)&version_min);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
LAB_001c1bdc:
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  if (uVar1 != 0x40) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"VERSION given too many arguments",(allocator<char> *)&version_min);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    goto LAB_001c1bdc;
  }
  pbVar5 = pbVar5 + 1;
  lVar2 = std::__cxx11::string::find((char *)pbVar5,0x41c360);
  std::__cxx11::string::substr((ulong)&version_min,(ulong)pbVar5);
  if (lVar2 == -1) {
    version_max._M_dataplus._M_p = (pointer)&version_max.field_2;
    version_max._M_string_length = 0;
    version_max.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&version_max,(ulong)pbVar5);
    if ((version_min._M_string_length == 0) || (version_max._M_string_length == 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,"VERSION \"");
      poVar3 = std::operator<<(poVar3,(string *)pbVar5);
      std::operator<<(poVar3,"\" does not have a version on both sides of \"...\".");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      bVar4 = false;
      goto LAB_001c1c10;
    }
  }
  bVar4 = true;
  cmMakefile::SetPolicyVersion((this->super_cmCommand).Makefile,&version_min,&version_max);
LAB_001c1c10:
  std::__cxx11::string::~string((string *)&version_max);
  std::__cxx11::string::~string((string *)&version_min);
  return bVar4;
}

Assistant:

bool cmCMakePolicyCommand::HandleVersionMode(
  std::vector<std::string> const& args)
{
  if (args.size() <= 1) {
    this->SetError("VERSION not given an argument");
    return false;
  }
  if (args.size() >= 3) {
    this->SetError("VERSION given too many arguments");
    return false;
  }
  std::string const& version_string = args[1];

  // Separate the <min> version and any trailing ...<max> component.
  std::string::size_type const dd = version_string.find("...");
  std::string const version_min = version_string.substr(0, dd);
  std::string const version_max = dd != std::string::npos
    ? version_string.substr(dd + 3, std::string::npos)
    : std::string();
  if (dd != std::string::npos &&
      (version_min.empty() || version_max.empty())) {
    std::ostringstream e;
    e << "VERSION \"" << version_string
      << "\" does not have a version on both sides of \"...\".";
    this->SetError(e.str());
    return false;
  }

  this->Makefile->SetPolicyVersion(version_min, version_max);
  return true;
}